

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketInitiator.cpp
# Opt level: O0

void __thiscall
FIX::SocketInitiator::onConnect(SocketInitiator *this,SocketConnector *param_1,socket_handle s)

{
  SocketConnection *this_00;
  bool bVar1;
  pointer ppVar2;
  mapped_type *ppSVar3;
  Session *this_01;
  SessionID *sessionID;
  SocketConnection *pSocketConnection;
  _Self local_28;
  iterator i;
  socket_handle s_local;
  SocketConnector *param_1_local;
  SocketInitiator *this_local;
  
  i._M_node._4_4_ = s;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
       ::find(&this->m_pendingConnections,(key_type *)((long)&i._M_node + 4));
  pSocketConnection =
       (SocketConnection *)
       std::
       map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
       ::end(&this->m_pendingConnections);
  bVar1 = std::operator==(&local_28,(_Self *)&pSocketConnection);
  if (!bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_FIX::SocketConnection_*>_>::operator->
                       (&local_28);
    this_00 = ppVar2->second;
    ppSVar3 = std::
              map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
              ::operator[](&this->m_connections,(key_type *)((long)&i._M_node + 4));
    *ppSVar3 = this_00;
    std::
    map<int,FIX::SocketConnection*,std::less<int>,std::allocator<std::pair<int_const,FIX::SocketConnection*>>>
    ::erase_abi_cxx11_((map<int,FIX::SocketConnection*,std::less<int>,std::allocator<std::pair<int_const,FIX::SocketConnection*>>>
                        *)&this->m_pendingConnections,(iterator)local_28._M_node);
    this_01 = SocketConnection::getSession(this_00);
    sessionID = Session::getSessionID(this_01);
    Initiator::setConnected(&this->super_Initiator,sessionID);
    SocketConnection::onTimeout(this_00);
  }
  return;
}

Assistant:

void SocketInitiator::onConnect(SocketConnector &, socket_handle s) {
  SocketConnections::iterator i = m_pendingConnections.find(s);
  if (i == m_pendingConnections.end()) {
    return;
  }
  SocketConnection *pSocketConnection = i->second;

  m_connections[s] = pSocketConnection;
  m_pendingConnections.erase(i);
  setConnected(pSocketConnection->getSession()->getSessionID());
  pSocketConnection->onTimeout();
}